

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::InstanceIntersector1>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  long lVar4;
  InstancePrimitive *prim;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  undefined1 auVar18 [32];
  undefined4 uVar19;
  undefined8 uVar20;
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [32];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  Precalculations pre;
  NodeRef stack [564];
  Precalculations local_1301;
  ulong *local_1300;
  Ray *local_12f8;
  RayQueryContext *local_12f0;
  InstancePrimitive *local_12e8;
  long local_12e0;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8 [565];
  
  local_11d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8[0] != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      aVar2 = (ray->dir).field_0.field_1;
      auVar3 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar13._8_4_ = 0x7fffffff;
      auVar13._0_8_ = 0x7fffffff7fffffff;
      auVar13._12_4_ = 0x7fffffff;
      auVar13 = vandps_avx512vl((undefined1  [16])aVar2,auVar13);
      auVar22._8_4_ = 0x219392ef;
      auVar22._0_8_ = 0x219392ef219392ef;
      auVar22._12_4_ = 0x219392ef;
      local_1300 = local_11d8 + 1;
      uVar10 = vcmpps_avx512vl(auVar13,auVar22,1);
      bVar5 = (bool)((byte)uVar10 & 1);
      auVar14._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * (int)aVar2.x;
      bVar5 = (bool)((byte)(uVar10 >> 1) & 1);
      auVar14._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * (int)aVar2.y;
      bVar5 = (bool)((byte)(uVar10 >> 2) & 1);
      auVar14._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * (int)aVar2.z;
      bVar5 = (bool)((byte)(uVar10 >> 3) & 1);
      auVar14._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * aVar2.field_3.a;
      auVar13 = vrcp14ps_avx512vl(auVar14);
      auVar15._8_4_ = 0x3f800000;
      auVar15._0_8_ = 0x3f8000003f800000;
      auVar15._12_4_ = 0x3f800000;
      auVar15 = vfnmadd213ps_avx512vl(auVar14,auVar13,auVar15);
      auVar14 = vfmadd132ps_fma(auVar15,auVar13,auVar13);
      fVar16 = auVar14._0_4_;
      local_1278._4_4_ = fVar16;
      local_1278._0_4_ = fVar16;
      local_1278._8_4_ = fVar16;
      local_1278._12_4_ = fVar16;
      local_1278._16_4_ = fVar16;
      local_1278._20_4_ = fVar16;
      local_1278._24_4_ = fVar16;
      local_1278._28_4_ = fVar16;
      auVar13 = vmovshdup_avx(auVar14);
      uVar20 = auVar13._0_8_;
      local_1298._8_8_ = uVar20;
      local_1298._0_8_ = uVar20;
      local_1298._16_8_ = uVar20;
      local_1298._24_8_ = uVar20;
      auVar15 = vshufpd_avx(auVar14,auVar14,1);
      auVar24._8_4_ = 2;
      auVar24._0_8_ = 0x200000002;
      auVar24._12_4_ = 2;
      auVar24._16_4_ = 2;
      auVar24._20_4_ = 2;
      auVar24._24_4_ = 2;
      auVar24._28_4_ = 2;
      local_12b8 = vpermps_avx2(auVar24,ZEXT1632(auVar14));
      fVar17 = fVar16 * (ray->org).field_0.m128[0];
      auVar27._8_4_ = 1;
      auVar27._0_8_ = 0x100000001;
      auVar27._12_4_ = 1;
      auVar27._16_4_ = 1;
      auVar27._20_4_ = 1;
      auVar27._24_4_ = 1;
      auVar27._28_4_ = 1;
      auVar18 = ZEXT1632(CONCAT412(auVar14._12_4_ * (ray->org).field_0.m128[3],
                                   CONCAT48(auVar14._8_4_ * (ray->org).field_0.m128[2],
                                            CONCAT44(auVar14._4_4_ * (ray->org).field_0.m128[1],
                                                     fVar17))));
      auVar27 = vpermps_avx2(auVar27,auVar18);
      auVar18 = vpermps_avx2(auVar24,auVar18);
      auVar25 = ZEXT3264(local_12b8);
      uVar11 = (ulong)(fVar16 < 0.0) * 0x20;
      auVar21 = ZEXT3264(local_1278);
      uVar12 = (ulong)(auVar13._0_4_ < 0.0) << 5 | 0x40;
      auVar23 = ZEXT3264(local_1298);
      uVar10 = (ulong)(auVar15._0_4_ < 0.0) << 5 | 0x80;
      local_12d8._0_8_ = CONCAT44(fVar17,fVar17) ^ 0x8000000080000000;
      local_12d8._8_4_ = -fVar17;
      local_12d8._12_4_ = -fVar17;
      local_12d8._16_4_ = -fVar17;
      local_12d8._20_4_ = -fVar17;
      local_12d8._24_4_ = -fVar17;
      local_12d8._28_4_ = -fVar17;
      auVar26 = ZEXT3264(local_12d8);
      local_11f8._0_8_ = auVar27._0_8_ ^ 0x8000000080000000;
      local_11f8._8_4_ = auVar27._8_4_ ^ 0x80000000;
      local_11f8._12_4_ = auVar27._12_4_ ^ 0x80000000;
      local_11f8._16_4_ = auVar27._16_4_ ^ 0x80000000;
      local_11f8._20_4_ = auVar27._20_4_ ^ 0x80000000;
      local_11f8._24_4_ = auVar27._24_4_ ^ 0x80000000;
      local_11f8._28_4_ = auVar27._28_4_ ^ 0x80000000;
      auVar28 = ZEXT3264(local_11f8);
      local_1218._0_8_ = auVar18._0_8_ ^ 0x8000000080000000;
      local_1218._8_4_ = auVar18._8_4_ ^ 0x80000000;
      local_1218._12_4_ = auVar18._12_4_ ^ 0x80000000;
      local_1218._16_4_ = auVar18._16_4_ ^ 0x80000000;
      local_1218._20_4_ = auVar18._20_4_ ^ 0x80000000;
      local_1218._24_4_ = auVar18._24_4_ ^ 0x80000000;
      local_1218._28_4_ = auVar18._28_4_ ^ 0x80000000;
      auVar29 = ZEXT3264(local_1218);
      uVar19 = auVar3._0_4_;
      local_1238._4_4_ = uVar19;
      local_1238._0_4_ = uVar19;
      local_1238._8_4_ = uVar19;
      local_1238._12_4_ = uVar19;
      local_1238._16_4_ = uVar19;
      local_1238._20_4_ = uVar19;
      local_1238._24_4_ = uVar19;
      local_1238._28_4_ = uVar19;
      auVar30 = ZEXT3264(local_1238);
      local_1258._4_4_ = fVar1;
      local_1258._0_4_ = fVar1;
      local_1258._8_4_ = fVar1;
      local_1258._12_4_ = fVar1;
      local_1258._16_4_ = fVar1;
      local_1258._20_4_ = fVar1;
      local_1258._24_4_ = fVar1;
      local_1258._28_4_ = fVar1;
      auVar31 = ZEXT3264(local_1258);
      local_12f8 = ray;
      local_12f0 = context;
LAB_01c7cc4a:
      if (local_1300 != local_11d8) {
        uVar7 = local_1300[-1];
        local_1300 = local_1300 + -1;
        while ((uVar7 & 8) == 0) {
          auVar3 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar7 + 0x40 + uVar11),auVar26._0_32_,
                                   auVar21._0_32_);
          auVar13 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar7 + 0x40 + uVar12),auVar28._0_32_,
                                    auVar23._0_32_);
          auVar27 = vpmaxsd_avx2(ZEXT1632(auVar3),ZEXT1632(auVar13));
          auVar3 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar7 + 0x40 + uVar10),auVar29._0_32_,
                                   auVar25._0_32_);
          auVar18 = vpmaxsd_avx2(ZEXT1632(auVar3),auVar30._0_32_);
          auVar27 = vpmaxsd_avx2(auVar27,auVar18);
          auVar3 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar7 + 0x40 + (uVar11 ^ 0x20)),
                                   auVar26._0_32_,auVar21._0_32_);
          auVar13 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar7 + 0x40 + (uVar12 ^ 0x20)),
                                    auVar28._0_32_,auVar23._0_32_);
          auVar18 = vpminsd_avx2(ZEXT1632(auVar3),ZEXT1632(auVar13));
          auVar3 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar7 + 0x40 + (uVar10 ^ 0x20)),
                                   auVar29._0_32_,auVar25._0_32_);
          auVar24 = vpminsd_avx2(ZEXT1632(auVar3),auVar31._0_32_);
          auVar18 = vpminsd_avx2(auVar18,auVar24);
          uVar9 = vpcmpd_avx512vl(auVar27,auVar18,2);
          if ((char)uVar9 == '\0') goto LAB_01c7cc4a;
          uVar6 = uVar7 & 0xfffffffffffffff0;
          lVar4 = 0;
          for (uVar7 = uVar9; (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x8000000000000000) {
            lVar4 = lVar4 + 1;
          }
          uVar7 = *(ulong *)(uVar6 + lVar4 * 8);
          uVar8 = (uint)uVar9 - 1 & (uint)uVar9;
          uVar9 = (ulong)uVar8;
          if (uVar8 != 0) {
            do {
              *local_1300 = uVar7;
              local_1300 = local_1300 + 1;
              lVar4 = 0;
              for (uVar7 = uVar9; (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x8000000000000000) {
                lVar4 = lVar4 + 1;
              }
              uVar9 = uVar9 - 1 & uVar9;
              uVar7 = *(ulong *)(uVar6 + lVar4 * 8);
            } while (uVar9 != 0);
          }
        }
        local_12e8 = (InstancePrimitive *)(uVar7 & 0xfffffffffffffff0);
        local_12e0 = (ulong)((uint)uVar7 & 0xf) - 7;
        while( true ) {
          local_12e0 = local_12e0 + -1;
          if (local_12e0 == 0) break;
          prim = local_12e8;
          local_12e8 = local_12e8 + 1;
          bVar5 = InstanceIntersector1::occluded(&local_1301,ray,local_12f0,prim);
          auVar31 = ZEXT3264(local_1258);
          auVar30 = ZEXT3264(local_1238);
          auVar29 = ZEXT3264(local_1218);
          auVar28 = ZEXT3264(local_11f8);
          ray = local_12f8;
          if (bVar5) {
            local_12f8->tfar = -INFINITY;
            return;
          }
        }
        auVar21 = ZEXT3264(local_1278);
        auVar23 = ZEXT3264(local_1298);
        auVar25 = ZEXT3264(local_12b8);
        auVar26 = ZEXT3264(local_12d8);
        goto LAB_01c7cc4a;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }